

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O1

void __thiscall unitStrings_numerical_Test::TestBody(unitStrings_numerical_Test *this)

{
  unit_data uVar1;
  precise_unit *ppVar2;
  string *__return_storage_ptr__;
  char *pcVar3;
  AssertionResult gtest_ar;
  unit odd;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  AssertHelper local_30;
  unit_data local_28;
  undefined4 local_24;
  undefined8 local_1c;
  float local_14;
  
  local_1c = 0x13e000000;
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  local_30.data_ = (AssertHelperData *)(double)(float)local_1c;
  local_28 = (unit_data)local_1c._4_4_;
  local_24 = 0;
  __return_storage_ptr__ = &local_50;
  units::to_string_abi_cxx11_
            (__return_storage_ptr__,(units *)&local_30,ppVar2,(ulong)local_1c._4_4_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            (local_60,"to_string(odd)","\"0.125m\"",__return_storage_ptr__,(char (*) [7])"0.125m");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_58->_M_dataplus)._M_p;
    }
    __return_storage_ptr__ = (string *)0x62;
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_14 = 1.0 / (float)local_1c;
  uVar1 = units::detail::unit_data::inv((unit_data *)((long)&local_1c + 4));
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  local_30.data_ = (AssertHelperData *)(double)local_14;
  local_24 = 0;
  local_28 = uVar1;
  units::to_string_abi_cxx11_(&local_50,(units *)&local_30,ppVar2,(uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_60,"to_string(odd.inv())","\"8/m\"",&local_50,(char (*) [4])"8/m");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  return;
}

Assistant:

TEST(unitStrings, numerical)
{
    auto odd = unit(0.125, m);
    EXPECT_EQ(to_string(odd), "0.125m");

    EXPECT_EQ(to_string(odd.inv()), "8/m");
}